

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O0

void MRIStepCoupling_Write(MRIStepCoupling MRIC,FILE *outfile)

{
  FILE *in_RSI;
  uint *in_RDI;
  int k;
  int j;
  int i;
  uint local_1c;
  int local_18;
  int local_14;
  
  if ((in_RDI != (uint *)0x0) &&
     (((*(long *)(in_RDI + 6) != 0 || (*(long *)(in_RDI + 8) != 0)) && (*(long *)(in_RDI + 4) != 0))
     )) {
    if (*(long *)(in_RDI + 6) != 0) {
      for (local_14 = 0; local_14 < (int)*in_RDI; local_14 = local_14 + 1) {
        if (*(long *)(*(long *)(in_RDI + 6) + (long)local_14 * 8) == 0) {
          return;
        }
        for (local_18 = 0; local_18 < (int)in_RDI[1]; local_18 = local_18 + 1) {
          if (*(long *)(*(long *)(*(long *)(in_RDI + 6) + (long)local_14 * 8) + (long)local_18 * 8)
              == 0) {
            return;
          }
        }
      }
    }
    if (*(long *)(in_RDI + 8) != 0) {
      for (local_14 = 0; local_14 < (int)*in_RDI; local_14 = local_14 + 1) {
        if (*(long *)(*(long *)(in_RDI + 8) + (long)local_14 * 8) == 0) {
          return;
        }
        for (local_18 = 0; local_18 < (int)in_RDI[1]; local_18 = local_18 + 1) {
          if (*(long *)(*(long *)(*(long *)(in_RDI + 8) + (long)local_14 * 8) + (long)local_18 * 8)
              == 0) {
            return;
          }
        }
      }
    }
    fprintf(in_RSI,"  nmat = %i\n",(ulong)*in_RDI);
    fprintf(in_RSI,"  stages = %i\n",(ulong)in_RDI[1]);
    fprintf(in_RSI,"  method order (q) = %i\n",(ulong)in_RDI[2]);
    fprintf(in_RSI,"  embedding order (p) = %i\n",(ulong)in_RDI[3]);
    fprintf(in_RSI,"  c = ");
    for (local_14 = 0; local_14 < (int)in_RDI[1]; local_14 = local_14 + 1) {
      fprintf(in_RSI,"%.16g  ",*(undefined8 *)(*(long *)(in_RDI + 4) + (long)local_14 * 8));
    }
    fprintf(in_RSI,"\n");
    if (*(long *)(in_RDI + 6) != 0) {
      for (local_1c = 0; (int)local_1c < (int)*in_RDI; local_1c = local_1c + 1) {
        fprintf(in_RSI,"  W[%i] = \n",(ulong)local_1c);
        for (local_14 = 0; local_14 < (int)in_RDI[1]; local_14 = local_14 + 1) {
          fprintf(in_RSI,"      ");
          for (local_18 = 0; local_18 < (int)in_RDI[1]; local_18 = local_18 + 1) {
            fprintf(in_RSI,"%23.16g  ",
                    *(undefined8 *)
                     (*(long *)(*(long *)(*(long *)(in_RDI + 6) + (long)(int)local_1c * 8) +
                               (long)local_14 * 8) + (long)local_18 * 8));
          }
          fprintf(in_RSI,"\n");
        }
        fprintf(in_RSI,"\n");
      }
    }
    if (*(long *)(in_RDI + 8) != 0) {
      for (local_1c = 0; (int)local_1c < (int)*in_RDI; local_1c = local_1c + 1) {
        fprintf(in_RSI,"  G[%i] = \n",(ulong)local_1c);
        for (local_14 = 0; local_14 < (int)in_RDI[1]; local_14 = local_14 + 1) {
          fprintf(in_RSI,"      ");
          for (local_18 = 0; local_18 < (int)in_RDI[1]; local_18 = local_18 + 1) {
            fprintf(in_RSI,"%23.16g  ",
                    *(undefined8 *)
                     (*(long *)(*(long *)(*(long *)(in_RDI + 8) + (long)(int)local_1c * 8) +
                               (long)local_14 * 8) + (long)local_18 * 8));
          }
          fprintf(in_RSI,"\n");
        }
        fprintf(in_RSI,"\n");
      }
    }
  }
  return;
}

Assistant:

void MRIStepCoupling_Write(MRIStepCoupling MRIC, FILE* outfile)
{
  int i, j, k;

  /* check for vaild coupling structure */
  if (!MRIC) { return; }
  if (!(MRIC->W) && !(MRIC->G)) { return; }
  if (!(MRIC->c)) { return; }

  if (MRIC->W)
  {
    for (i = 0; i < MRIC->nmat; i++)
    {
      if (!(MRIC->W[i])) { return; }
      for (j = 0; j < MRIC->stages; j++)
      {
        if (!(MRIC->W[i][j])) { return; }
      }
    }
  }

  if (MRIC->G)
  {
    for (i = 0; i < MRIC->nmat; i++)
    {
      if (!(MRIC->G[i])) { return; }
      for (j = 0; j < MRIC->stages; j++)
      {
        if (!(MRIC->G[i][j])) { return; }
      }
    }
  }

  fprintf(outfile, "  nmat = %i\n", MRIC->nmat);
  fprintf(outfile, "  stages = %i\n", MRIC->stages);
  fprintf(outfile, "  method order (q) = %i\n", MRIC->q);
  fprintf(outfile, "  embedding order (p) = %i\n", MRIC->p);
  fprintf(outfile, "  c = ");
  for (i = 0; i < MRIC->stages; i++)
  {
    fprintf(outfile, "%" RSYM "  ", MRIC->c[i]);
  }
  fprintf(outfile, "\n");

  if (MRIC->W)
  {
    for (k = 0; k < MRIC->nmat; k++)
    {
      fprintf(outfile, "  W[%i] = \n", k);
      for (i = 0; i < MRIC->stages; i++)
      {
        fprintf(outfile, "      ");
        for (j = 0; j < MRIC->stages; j++)
        {
          fprintf(outfile, "%" RSYMW "  ", MRIC->W[k][i][j]);
        }
        fprintf(outfile, "\n");
      }
      fprintf(outfile, "\n");
    }
  }

  if (MRIC->G)
  {
    for (k = 0; k < MRIC->nmat; k++)
    {
      fprintf(outfile, "  G[%i] = \n", k);
      for (i = 0; i < MRIC->stages; i++)
      {
        fprintf(outfile, "      ");
        for (j = 0; j < MRIC->stages; j++)
        {
          fprintf(outfile, "%" RSYMW "  ", MRIC->G[k][i][j]);
        }
        fprintf(outfile, "\n");
      }
      fprintf(outfile, "\n");
    }
  }
}